

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int mbedtls_x509_get_ext(uchar **p,uchar *end,mbedtls_x509_buf *ext,int tag)

{
  size_t local_38;
  size_t len;
  int ret;
  int tag_local;
  mbedtls_x509_buf *ext_local;
  uchar *end_local;
  uchar **p_local;
  
  len._0_4_ = 0xffffff92;
  len._4_4_ = tag;
  _ret = ext;
  ext_local = (mbedtls_x509_buf *)end;
  end_local = (uchar *)p;
  len._0_4_ = mbedtls_asn1_get_tag(p,end,&ext->len,tag | 0xa0);
  if ((int)len == 0) {
    _ret->tag = len._4_4_ | 0xa0;
    _ret->p = *(uchar **)end_local;
    ext_local = (mbedtls_x509_buf *)(*(long *)end_local + _ret->len);
    len._0_4_ = mbedtls_asn1_get_tag((uchar **)end_local,(uchar *)ext_local,&local_38,0x30);
    if ((int)len == 0) {
      if (ext_local == (mbedtls_x509_buf *)(*(long *)end_local + local_38)) {
        p_local._4_4_ = 0;
      }
      else {
        p_local._4_4_ =
             mbedtls_error_add(-0x2500,-0x66,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509.c"
                               ,0x31d);
      }
    }
    else {
      p_local._4_4_ =
           mbedtls_error_add(-0x2500,(int)len,
                             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509.c"
                             ,0x318);
    }
  }
  else {
    p_local._4_4_ =
         mbedtls_error_add(-0x2500,(int)len,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509.c"
                           ,0x30c);
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_x509_get_ext(unsigned char **p, const unsigned char *end,
                         mbedtls_x509_buf *ext, int tag)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;

    /* Extension structure use EXPLICIT tagging. That is, the actual
     * `Extensions` structure is wrapped by a tag-length pair using
     * the respective context-specific tag. */
    ret = mbedtls_asn1_get_tag(p, end, &ext->len,
                               MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | tag);
    if (ret != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
    }

    ext->tag = MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | tag;
    ext->p   = *p;
    end      = *p + ext->len;

    /*
     * Extensions  ::=  SEQUENCE SIZE (1..MAX) OF Extension
     */
    if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
    }

    if (end != *p + len) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    return 0;
}